

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.cpp
# Opt level: O2

int __thiscall P_Assertion::match(P_Assertion *this,vector<StateP,_std::allocator<StateP>_> *stk)

{
  int *piVar1;
  bool bVar2;
  uint uVar3;
  State SStack_78;
  
  State::State(&SStack_78,
               &(stk->super__Vector_base<StateP,_std::allocator<StateP>_>)._M_impl.
                super__Vector_impl_data._M_finish[-1].st);
  uVar3 = ::match(&SStack_78,this->pattern,false);
  bVar2 = this->value;
  State::~State(&SStack_78);
  if (uVar3 == bVar2) {
    piVar1 = &(stk->super__Vector_base<StateP,_std::allocator<StateP>_>)._M_impl.
              super__Vector_impl_data._M_finish[-1].iseq;
    *piVar1 = *piVar1 + 1;
  }
  else {
    std::vector<StateP,_std::allocator<StateP>_>::pop_back(stk);
  }
  return 0;
}

Assistant:

int P_Assertion::match(vector<StateP> &stk) {
    if ((int) ::match(stk.back().st, pattern) == (int) value) {
        stk.back().iseq++;
    } else {
        stk.pop_back();
    }
    return 0;
}